

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O3

void lace_init_worker(uint worker)

{
  worker_data *pwVar1;
  Task *pTVar2;
  size_t __n;
  worker_data **ppwVar3;
  uint uVar4;
  int iVar5;
  worker_data *__s;
  long in_FS_OFFSET;
  
  __n = workers_memory_size;
  __s = (worker_data *)aligned_alloc(0x40);
  ppwVar3 = workers_memory;
  workers_memory[worker] = __s;
  if (__s != (worker_data *)0x0) {
    memset(__s,0,__n);
    workers[worker] = (Worker *)__s;
    pwVar1 = ppwVar3[worker];
    workers_p[worker] = &pwVar1->worker_private;
    (pwVar1->worker_private).dq = (Task *)(pwVar1 + 1);
    *(WorkerP **)(in_FS_OFFSET + -8) = &pwVar1->worker_private;
    (__s->worker_public).dq = (Task *)(pwVar1 + 1);
    LOCK();
    (__s->worker_public).ts = (TailSplit)0x0;
    UNLOCK();
    (__s->worker_public).allstolen = '\0';
    (__s->worker_public).movesplit = '\0';
    (pwVar1->worker_private)._public = (Worker *)__s;
    pTVar2 = (pwVar1->worker_private).dq;
    (pwVar1->worker_private).end = pTVar2 + default_dqsize;
    (pwVar1->worker_private).split = pTVar2;
    (pwVar1->worker_private).allstolen = '\0';
    (pwVar1->worker_private).worker = (uint16_t)worker;
    (pwVar1->worker_private).pu = -1;
    uVar4 = rand();
    iVar5 = rand();
    (pwVar1->worker_private).rng = (long)iVar5 | (ulong)uVar4 << 0x20;
    return;
  }
  lace_init_worker_cold_1();
  do {
  } while (lace_awaken_count < 1);
  if (lace_awaken_count != 1) {
    LOCK();
    lace_awaken_count = lace_awaken_count + -1;
    UNLOCK();
    return;
  }
  LOCK();
  UNLOCK();
  do {
  } while (workers_running != n_workers);
  do {
  } while (workers_running != 0);
  must_suspend = 0;
  lace_awaken_count = 0;
  return;
}

Assistant:

void
lace_init_worker(unsigned int worker)
{
    // Allocate our memory
#if LACE_USE_MMAP
    workers_memory[worker] = mmap(NULL, workers_memory_size, PROT_READ|PROT_WRITE, MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
    if (workers_memory[worker] == MAP_FAILED) {
        fprintf(stderr, "Lace error: Unable to allocate mmapped memory for the Lace worker!\n");
        exit(1);
    }
#else
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    workers_memory[worker] = _aligned_malloc(workers_memory_size, LINE_SIZE);
#elif defined(__MINGW32__)
    workers_memory[worker] = __mingw_aligned_malloc(workers_memory_size, LINE_SIZE);
#else
    workers_memory[worker] = aligned_alloc(LINE_SIZE, workers_memory_size);
#endif
    if (workers_memory[worker] == 0) {
        fprintf(stderr, "Lace error: Unable to allocate memory for the Lace worker!\n");
        exit(1);
    }
    memset(workers_memory[worker], 0, workers_memory_size);
#endif

    // Set pointers
    Worker *wt = workers[worker] = &workers_memory[worker]->worker_public;
    WorkerP *w = workers_p[worker] = &workers_memory[worker]->worker_private;
    w->dq = workers_memory[worker]->deque;
#ifdef __linux__
    current_worker = w;
#else
    pthread_setspecific(current_worker_key, w);
#endif

    // Initialize public worker data
    wt->dq = w->dq;
    wt->ts.v = 0;
    wt->allstolen = 0;
    wt->movesplit = 0;

    // Initialize private worker data
    w->_public = wt;
    w->end = w->dq + default_dqsize;
    w->split = w->dq;
    w->allstolen = 0;
    w->worker = worker;
#if LACE_USE_HWLOC
    w->pu = worker % n_cores;
#else
    w->pu = -1;
#endif
    w->rng = (((uint64_t)rand())<<32 | rand());

#if LACE_COUNT_EVENTS
    // Initialize counters
    { int k; for (k=0; k<CTR_MAX; k++) w->ctr[k] = 0; }
#endif

#if LACE_PIE_TIMES
    w->time = gethrtime();
    w->level = 0;
#endif
}